

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O2

void __thiscall
cm::uv_handle_ptr_base_<uv_async_s>::allocate(uv_handle_ptr_base_<uv_async_s> *this,void *data)

{
  uv_async_s *__p;
  uv_handle_deleter<uv_async_s> local_30;
  
  std::__shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2> *)this);
  __p = (uv_async_s *)calloc(1,0x80);
  std::make_shared<std::mutex>();
  std::__shared_ptr<uv_async_s,(__gnu_cxx::_Lock_policy)2>::
  reset<uv_async_s,cm::uv_handle_deleter<uv_async_s>>
            ((__shared_ptr<uv_async_s,(__gnu_cxx::_Lock_policy)2> *)this,__p,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.handleMutex.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ((this->handle).super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data = data;
  return;
}

Assistant:

void uv_handle_ptr_base_<T>::allocate(void* data)
{
  this->reset();

  /*
    We use calloc since we know all these types are c structs
    and we just want to 0 init them. New would do the same thing;
    but casting from uv_handle_t to certain other types -- namely
    uv_timer_t -- triggers a cast_align warning on certain systems.
  */
  this->handle.reset(static_cast<T*>(calloc(1, sizeof(T))),
                     uv_handle_deleter<T>());
  this->handle->data = data;
}